

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scorer.cc
# Opt level: O3

void multipredict<&expf>(scorer *param_1,single_learner *base,example *ec,size_t count,
                        size_t param_5,polyprediction *pred,bool finalize_predictions)

{
  float *pfVar1;
  float *pfVar2;
  size_t sVar3;
  uint64_t uVar4;
  size_t sVar5;
  polyprediction *ppVar6;
  float fVar7;
  
  if (*(code **)(base + 0x40) == (code *)0x0) {
    if (count == 0) {
      uVar4 = (ec->super_example_predict).ft_offset;
    }
    else {
      sVar5 = count;
      ppVar6 = pred;
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        if (finalize_predictions) {
          pfVar1 = (ec->pred).scalars._begin;
          pfVar2 = (ec->pred).scalars._end;
          sVar3 = (ec->pred).scalars.erase_count;
          (ppVar6->scalars).end_array = (ec->pred).scalars.end_array;
          (ppVar6->scalars).erase_count = sVar3;
          (ppVar6->scalars)._begin = pfVar1;
          (ppVar6->scalars)._end = pfVar2;
        }
        else {
          ppVar6->scalar = ec->partial_prediction;
        }
        uVar4 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
        (ec->super_example_predict).ft_offset = uVar4;
        ppVar6 = ppVar6 + 1;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
    uVar4 = uVar4 - (uint)(*(int *)(base + 0xe0) * (int)count);
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,count,
               *(undefined8 *)(base + 0xe0),pred,finalize_predictions);
    uVar4 = (ec->super_example_predict).ft_offset;
  }
  (ec->super_example_predict).ft_offset = uVar4;
  if (count != 0) {
    do {
      fVar7 = expf(pred->scalar);
      pred->scalar = fVar7;
      pred = pred + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

inline void multipredict(scorer&, LEARNER::single_learner& base, example& ec, size_t count, size_t,
    polyprediction* pred, bool finalize_predictions)
{
  base.multipredict(ec, 0, count, pred, finalize_predictions);  // TODO: need to thread step through???
  for (size_t c = 0; c < count; c++) pred[c].scalar = link(pred[c].scalar);
}